

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<long_double,_10>::Resize
          (TPZManVector<long_double,_10> *this,int64_t newsize,longdouble *object)

{
  longdouble lVar1;
  long lVar2;
  ostream *poVar3;
  longdouble *plVar4;
  longdouble *plVar5;
  longdouble *plVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  
  if (newsize < 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::ostream::flush();
    return;
  }
  lVar8 = (this->super_TPZVec<long_double>).fNElements;
  if (lVar8 != newsize) {
    lVar9 = (this->super_TPZVec<long_double>).fNAlloc;
    if (lVar9 < newsize) {
      if ((ulong)newsize < 0xb) {
        plVar5 = (this->super_TPZVec<long_double>).fStore;
        plVar4 = this->fExtAlloc;
        lVar2 = 0;
        lVar9 = lVar8;
        if (lVar8 < 1) {
          lVar8 = lVar2;
          lVar9 = lVar2;
        }
        while (lVar8 != 0) {
          *(unkbyte10 *)((long)plVar4 + lVar2) = *(unkbyte10 *)((long)plVar5 + lVar2);
          lVar2 = lVar2 + 0x10;
          lVar8 = lVar8 + -1;
        }
        plVar6 = this->fExtAlloc + lVar9;
        for (; lVar9 < newsize; lVar9 = lVar9 + 1) {
          *plVar6 = *object;
          plVar6 = plVar6 + 1;
        }
        if (plVar5 != (longdouble *)0x0 && plVar5 != plVar4) {
          operator_delete__(plVar5);
        }
        (this->super_TPZVec<long_double>).fStore = plVar4;
        (this->super_TPZVec<long_double>).fNElements = newsize;
        (this->super_TPZVec<long_double>).fNAlloc = 10;
      }
      else {
        dVar10 = (double)lVar9 * 1.2;
        uVar7 = (long)dVar10;
        if (dVar10 < (double)newsize) {
          uVar7 = newsize;
        }
        lVar2 = 0;
        plVar5 = (longdouble *)operator_new__(-(ulong)(uVar7 >> 0x3c != 0) | uVar7 << 4);
        plVar4 = (this->super_TPZVec<long_double>).fStore;
        lVar9 = lVar8;
        if (lVar8 < 1) {
          lVar8 = lVar2;
          lVar9 = lVar2;
        }
        while (lVar8 != 0) {
          *(unkbyte10 *)((long)plVar5 + lVar2) = *(unkbyte10 *)((long)plVar4 + lVar2);
          lVar2 = lVar2 + 0x10;
          lVar8 = lVar8 + -1;
        }
        lVar1 = *object;
        plVar6 = plVar5 + lVar9;
        for (; lVar9 < newsize; lVar9 = lVar9 + 1) {
          *plVar6 = lVar1;
          plVar6 = plVar6 + 1;
        }
        if (plVar4 != (longdouble *)0x0 && plVar4 != this->fExtAlloc) {
          operator_delete__(plVar4);
        }
        (this->super_TPZVec<long_double>).fStore = plVar5;
        (this->super_TPZVec<long_double>).fNElements = newsize;
        (this->super_TPZVec<long_double>).fNAlloc = uVar7;
      }
    }
    else {
      plVar4 = (this->super_TPZVec<long_double>).fStore + lVar8;
      for (; lVar8 < newsize; lVar8 = lVar8 + 1) {
        *plVar4 = *object;
        plVar4 = plVar4 + 1;
      }
      (this->super_TPZVec<long_double>).fNElements = newsize;
    }
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}